

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_PDU.cpp
# Opt level: O1

KBOOL __thiscall KDIS::PDU::Data_Query_PDU::operator==(Data_Query_PDU *this,Data_Query_PDU *Value)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  KBOOL KVar4;
  int iVar5;
  size_t sVar6;
  
  KVar4 = Simulation_Management_Header::operator!=
                    (&this->super_Simulation_Management_Header,
                     &Value->super_Simulation_Management_Header);
  if ((((!KVar4) &&
       (KVar4 = DATA_TYPE::TimeStamp::operator!=(&this->m_TimeInterval,&Value->m_TimeInterval),
       !KVar4)) && (this->m_ui32NumFixedDatum == Value->m_ui32NumFixedDatum)) &&
     (this->m_ui32NumVariableDatum == Value->m_ui32NumVariableDatum)) {
    puVar1 = (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    sVar6 = (long)puVar2 - (long)puVar1;
    puVar3 = (Value->m_vFixedDatum).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((sVar6 == (long)(Value->m_vFixedDatum).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar3) &&
       ((puVar2 == puVar1 || (iVar5 = bcmp(puVar1,puVar3,sVar6), iVar5 == 0)))) {
      puVar1 = (this->m_vVariableDatum).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (this->m_vVariableDatum).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      sVar6 = (long)puVar2 - (long)puVar1;
      puVar3 = (Value->m_vVariableDatum).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (sVar6 == (long)(Value->m_vVariableDatum).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar3) {
        if (puVar2 != puVar1) {
          iVar5 = bcmp(puVar1,puVar3,sVar6);
          return iVar5 == 0;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

KBOOL Data_Query_PDU::operator == ( const Data_Query_PDU & Value ) const
{
    if( Simulation_Management_Header::operator !=( Value ) )     return false;
    if( m_TimeInterval         != Value.m_TimeInterval )         return false;
    if( m_ui32NumFixedDatum    != Value.m_ui32NumFixedDatum )    return false;
    if( m_ui32NumVariableDatum != Value.m_ui32NumVariableDatum ) return false;
    if( m_vFixedDatum          != Value.m_vFixedDatum )          return false;
    if( m_vVariableDatum       != Value.m_vVariableDatum )       return false;
    return true;
}